

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonNode * jsonMergePatch(JsonParse *pParse,u32 iTarget,JsonNode *pPatch)

{
  uint n;
  char *__s2;
  int iVar1;
  uint uVar2;
  u32 uVar3;
  JsonNode *pJVar4;
  int iPatch;
  int iStart;
  JsonNode *pNew;
  char *zKey;
  JsonParse *pJStack_40;
  u32 nKey;
  JsonNode *pTarget;
  uint local_30;
  u32 iRoot;
  u32 j;
  u32 i;
  JsonNode *pPatch_local;
  u32 iTarget_local;
  JsonParse *pParse_local;
  
  pParse_local = (JsonParse *)pPatch;
  if (pPatch->eType == '\a') {
    pJStack_40 = (JsonParse *)(pParse->aNode + iTarget);
    if ((u8)pJStack_40->nNode == '\a') {
      pTarget._4_4_ = iTarget;
      for (iRoot = 1; iRoot < pPatch->n; iRoot = uVar3 + 1 + iRoot) {
        n = pPatch[iRoot].n;
        __s2 = pPatch[iRoot].u.zJContent;
        for (local_30 = 1; local_30 < pJStack_40->nAlloc; local_30 = uVar3 + 1 + local_30) {
          if (((&pJStack_40->nAlloc)[(ulong)local_30 * 4] == n) &&
             (iVar1 = strncmp(((anon_union_8_5_9b08aacb_for_u *)&pJStack_40->aNode)
                              [(ulong)local_30 * 2].zJContent,__s2,(ulong)n), iVar1 == 0)) {
            if ((*(u8 *)((long)&pJStack_40->nNode + (ulong)(local_30 + 1) * 0x10 + 1) & 0x14) == 0)
            {
              if (pPatch[iRoot + 1].eType == '\0') {
                *(byte *)((long)&pJStack_40->nNode + (ulong)(local_30 + 1) * 0x10 + 1) =
                     *(u8 *)((long)&pJStack_40->nNode + (ulong)(local_30 + 1) * 0x10 + 1) | 4;
              }
              else {
                pJVar4 = jsonMergePatch(pParse,iTarget + local_30 + 1,pPatch + (iRoot + 1));
                if (pJVar4 == (JsonNode *)0x0) {
                  return (JsonNode *)0x0;
                }
                pJStack_40 = (JsonParse *)(pParse->aNode + iTarget);
                if (pJVar4 != (JsonNode *)(&pJStack_40->nNode + (ulong)(local_30 + 1) * 4)) {
                  ((anon_union_8_5_9b08aacb_for_u *)&pJStack_40->aNode)[(ulong)(local_30 + 1) * 2].
                  pPatch = pJVar4;
                  *(byte *)((long)&pJStack_40->nNode + (ulong)(local_30 + 1) * 0x10 + 1) =
                       *(u8 *)((long)&pJStack_40->nNode + (ulong)(local_30 + 1) * 0x10 + 1) | 0x10;
                }
              }
            }
            break;
          }
          uVar3 = jsonNodeSize((JsonNode *)(&pJStack_40->nNode + (ulong)(local_30 + 1) * 4));
        }
        if ((pJStack_40->nAlloc <= local_30) && (pPatch[iRoot + 1].eType != '\0')) {
          uVar2 = jsonParseAddNode(pParse,7,2,(char *)0x0);
          jsonParseAddNode(pParse,5,n,__s2);
          iVar1 = jsonParseAddNode(pParse,1,0,(char *)0x0);
          if (pParse->oom != '\0') {
            return (JsonNode *)0x0;
          }
          jsonRemoveAllNulls(pPatch);
          pJStack_40 = (JsonParse *)(pParse->aNode + iTarget);
          pParse->aNode[pTarget._4_4_].jnFlags = pParse->aNode[pTarget._4_4_].jnFlags | 0x20;
          pParse->aNode[pTarget._4_4_].u.iAppend = uVar2 - pTarget._4_4_;
          pParse->aNode[iVar1].jnFlags = pParse->aNode[iVar1].jnFlags | 0x10;
          pParse->aNode[iVar1].u.zJContent = (char *)(pPatch + (iRoot + 1));
          pTarget._4_4_ = uVar2;
        }
        uVar3 = jsonNodeSize(pPatch + (iRoot + 1));
      }
      pParse_local = pJStack_40;
    }
    else {
      jsonRemoveAllNulls(pPatch);
    }
  }
  return (JsonNode *)pParse_local;
}

Assistant:

static JsonNode *jsonMergePatch(
  JsonParse *pParse,   /* The JSON parser that contains the TARGET */
  u32 iTarget,         /* Node of the TARGET in pParse */
  JsonNode *pPatch     /* The PATCH */
){
  u32 i, j;
  u32 iRoot;
  JsonNode *pTarget;
  if( pPatch->eType!=JSON_OBJECT ){
    return pPatch;
  }
  assert( iTarget<pParse->nNode );
  pTarget = &pParse->aNode[iTarget];
  assert( (pPatch->jnFlags & JNODE_APPEND)==0 );
  if( pTarget->eType!=JSON_OBJECT ){
    jsonRemoveAllNulls(pPatch);
    return pPatch;
  }
  iRoot = iTarget;
  for(i=1; i<pPatch->n; i += jsonNodeSize(&pPatch[i+1])+1){
    u32 nKey;
    const char *zKey;
    assert( pPatch[i].eType==JSON_STRING );
    assert( pPatch[i].jnFlags & JNODE_LABEL );
    assert( pPatch[i].eU==1 );
    nKey = pPatch[i].n;
    zKey = pPatch[i].u.zJContent;
    assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
    for(j=1; j<pTarget->n; j += jsonNodeSize(&pTarget[j+1])+1 ){
      assert( pTarget[j].eType==JSON_STRING );
      assert( pTarget[j].jnFlags & JNODE_LABEL );
      assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
      if( pTarget[j].n==nKey && strncmp(pTarget[j].u.zJContent,zKey,nKey)==0 ){
        if( pTarget[j+1].jnFlags & (JNODE_REMOVE|JNODE_PATCH) ) break;
        if( pPatch[i+1].eType==JSON_NULL ){
          pTarget[j+1].jnFlags |= JNODE_REMOVE;
        }else{
          JsonNode *pNew = jsonMergePatch(pParse, iTarget+j+1, &pPatch[i+1]);
          if( pNew==0 ) return 0;
          pTarget = &pParse->aNode[iTarget];
          if( pNew!=&pTarget[j+1] ){
            assert( pTarget[j+1].eU==0
                 || pTarget[j+1].eU==1
                 || pTarget[j+1].eU==2 );
            testcase( pTarget[j+1].eU==1 );
            testcase( pTarget[j+1].eU==2 );
            VVA( pTarget[j+1].eU = 5 );
            pTarget[j+1].u.pPatch = pNew;
            pTarget[j+1].jnFlags |= JNODE_PATCH;
          }
        }
        break;
      }
    }
    if( j>=pTarget->n && pPatch[i+1].eType!=JSON_NULL ){
      int iStart, iPatch;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      iPatch = jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
      if( pParse->oom ) return 0;
      jsonRemoveAllNulls(pPatch);
      pTarget = &pParse->aNode[iTarget];
      assert( pParse->aNode[iRoot].eU==0 || pParse->aNode[iRoot].eU==2 );
      testcase( pParse->aNode[iRoot].eU==2 );
      pParse->aNode[iRoot].jnFlags |= JNODE_APPEND;
      VVA( pParse->aNode[iRoot].eU = 2 );
      pParse->aNode[iRoot].u.iAppend = iStart - iRoot;
      iRoot = iStart;
      assert( pParse->aNode[iPatch].eU==0 );
      VVA( pParse->aNode[iPatch].eU = 5 );
      pParse->aNode[iPatch].jnFlags |= JNODE_PATCH;
      pParse->aNode[iPatch].u.pPatch = &pPatch[i+1];
    }
  }
  return pTarget;
}